

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
               (Var arg,ScriptContext *scriptContext,PCWSTR methodName,JavascriptArray **array,
               RecyclableObject **obj,BigIndex *length)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  JavascriptCopyOnAccessNativeIntArray *this;
  uint64 initIndex;
  BigIndex local_50;
  PCWSTR local_40;
  BigIndex *local_38;
  
  local_40 = methodName;
  local_38 = length;
  if (array == (JavascriptArray **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6c,"(array != nullptr)","array != nullptr");
    if (!bVar2) goto LAB_00b8c33d;
    *puVar5 = 0;
  }
  if (obj == (RecyclableObject **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6d,"(obj != nullptr)","obj != nullptr");
    if (!bVar2) goto LAB_00b8c33d;
    *puVar5 = 0;
  }
  if (local_38 == (BigIndex *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xc6e,"(length != nullptr)","length != nullptr");
    if (!bVar2) {
LAB_00b8c33d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = IsNonES5Array(arg);
  if (bVar2) {
    pJVar6 = UnsafeVarTo<Js::JavascriptArray>(arg);
    *array = pJVar6;
    if ((pJVar6 != (JavascriptArray *)0x0) &&
       (iVar3 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x66])(pJVar6), iVar3 == 0)) {
      pJVar6 = *array;
      if ((pJVar6 != (JavascriptArray *)0x0) &&
         ((bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar6), bVar2 &&
          (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar6),
          this != (JavascriptCopyOnAccessNativeIntArray *)0x0)))) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
      }
      pJVar6 = *array;
      *obj = (RecyclableObject *)pJVar6;
      BigIndex::BigIndex(&local_50,(pJVar6->super_ArrayObject).length);
      local_38->index = local_50.index;
      *(undefined4 *)&local_38->field_0x4 = local_50._4_4_;
      local_38->bigIndex = local_50.bigIndex;
      return;
    }
  }
  else {
    *array = (JavascriptArray *)0x0;
  }
  BVar4 = JavascriptConversion::ToObject(arg,scriptContext,obj);
  if (BVar4 != 0) {
    initIndex = OP_GetLength(*obj,scriptContext);
    BigIndex::BigIndex(&local_50,initIndex);
    local_38->index = local_50.index;
    *(undefined4 *)&local_38->field_0x4 = local_50._4_4_;
    local_38->bigIndex = local_50.bigIndex;
    *array = (JavascriptArray *)0x0;
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,local_40);
}

Assistant:

void JavascriptArray::TryGetArrayAndLength(Var arg,
        ScriptContext *scriptContext,
        PCWSTR methodName,
        __out JavascriptArray** array,
        __out RecyclableObject** obj,
        __out T * length)
    {
        Assert(array != nullptr);
        Assert(obj != nullptr);
        Assert(length != nullptr);

        *array = JavascriptArray::TryVarToNonES5Array(arg);
        if (*array && !(*array)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(*array);
#endif
            *obj = *array;
            *length = (*array)->length;
        }
        else
        {
            if (!JavascriptConversion::ToObject(arg, scriptContext, obj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, methodName);
            }
            *length = OP_GetLength(*obj, scriptContext);
            *array = nullptr;
        }
    }